

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O3

zmsg_t * czhelp_zmsg_createv(char *picture,__va_list_tag *argptr)

{
  byte bVar1;
  uint uVar2;
  zmsg_t *self;
  zchunk_t *self_00;
  zuuid_t *self_01;
  zmsg_t *self_02;
  int *piVar3;
  byte *pbVar4;
  undefined8 *puVar5;
  ushort *puVar6;
  uint *puVar7;
  zframe_t *pzVar8;
  byte *data;
  size_t sVar9;
  ulong uVar10;
  char *format;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *data_00;
  void *pointer;
  undefined1 local_50 [32];
  
  self_02 = zmsg_new();
  do {
    bVar1 = *picture;
    if (bVar1 < 0x62) {
      switch(bVar1) {
      case 0x31:
        uVar2 = argptr->gp_offset;
        if ((ulong)uVar2 < 0x29) {
          pbVar4 = (byte *)((ulong)uVar2 + (long)argptr->reg_save_area);
          argptr->gp_offset = uVar2 + 8;
        }
        else {
          pbVar4 = (byte *)argptr->overflow_arg_area;
          argptr->overflow_arg_area = pbVar4 + 8;
        }
        uVar10 = (ulong)*pbVar4;
        break;
      case 0x32:
        uVar2 = argptr->gp_offset;
        if ((ulong)uVar2 < 0x29) {
          puVar6 = (ushort *)((ulong)uVar2 + (long)argptr->reg_save_area);
          argptr->gp_offset = uVar2 + 8;
        }
        else {
          puVar6 = (ushort *)argptr->overflow_arg_area;
          argptr->overflow_arg_area = puVar6 + 4;
        }
        uVar10 = (ulong)*puVar6;
        break;
      case 0x33:
      case 0x35:
      case 0x36:
      case 0x37:
        goto switchD_0020fa04_caseD_65;
      case 0x34:
        uVar2 = argptr->gp_offset;
        if ((ulong)uVar2 < 0x29) {
          puVar7 = (uint *)((ulong)uVar2 + (long)argptr->reg_save_area);
          argptr->gp_offset = uVar2 + 8;
        }
        else {
          puVar7 = (uint *)argptr->overflow_arg_area;
          argptr->overflow_arg_area = puVar7 + 2;
        }
        uVar10 = (ulong)*puVar7;
        break;
      case 0x38:
        uVar2 = argptr->gp_offset;
        if ((ulong)uVar2 < 0x29) {
          puVar5 = (undefined8 *)((ulong)uVar2 + (long)argptr->reg_save_area);
          argptr->gp_offset = uVar2 + 8;
        }
        else {
          puVar5 = (undefined8 *)argptr->overflow_arg_area;
          argptr->overflow_arg_area = puVar5 + 1;
        }
        zmsg_addstrf(self_02,"%lu",*puVar5);
        goto LAB_0020feb9;
      default:
        if (bVar1 == 0x55) {
          uVar2 = argptr->gp_offset;
          if ((ulong)uVar2 < 0x29) {
            puVar5 = (undefined8 *)((ulong)uVar2 + (long)argptr->reg_save_area);
            argptr->gp_offset = uVar2 + 8;
          }
          else {
            puVar5 = (undefined8 *)argptr->overflow_arg_area;
            argptr->overflow_arg_area = puVar5 + 1;
          }
          self_01 = (zuuid_t *)*puVar5;
          data = zuuid_data(self_01);
          sVar9 = zuuid_size(self_01);
          goto LAB_0020feaa;
        }
        if (bVar1 == 0) {
          return self_02;
        }
        goto switchD_0020fa04_caseD_65;
      }
      format = "%u";
LAB_0020fd1e:
      zmsg_addstrf(self_02,format,uVar10);
      goto LAB_0020feb9;
    }
    switch(bVar1) {
    case 0x62:
      uVar2 = argptr->gp_offset;
      uVar10 = (ulong)uVar2;
      if (uVar10 < 0x29) {
        argptr->gp_offset = (uint)(uVar10 + 8);
        data_00 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                   ((long)argptr->reg_save_area + uVar10);
        if (0x20 < uVar2) goto LAB_0020fd61;
        piVar3 = (int *)(uVar10 + 8 + (long)argptr->reg_save_area);
        argptr->gp_offset = uVar2 + 0x10;
      }
      else {
        puVar5 = (undefined8 *)argptr->overflow_arg_area;
        argptr->overflow_arg_area = puVar5 + 1;
        data_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar5;
LAB_0020fd61:
        piVar3 = (int *)argptr->overflow_arg_area;
        argptr->overflow_arg_area = piVar3 + 2;
      }
      sVar9 = (size_t)*piVar3;
      goto LAB_0020fd73;
    case 99:
      uVar2 = argptr->gp_offset;
      if ((ulong)uVar2 < 0x29) {
        puVar5 = (undefined8 *)((ulong)uVar2 + (long)argptr->reg_save_area);
        argptr->gp_offset = uVar2 + 8;
      }
      else {
        puVar5 = (undefined8 *)argptr->overflow_arg_area;
        argptr->overflow_arg_area = puVar5 + 1;
      }
      self_00 = (zchunk_t *)*puVar5;
      data = zchunk_data(self_00);
      sVar9 = zchunk_size(self_00);
      goto LAB_0020feaa;
    case 100:
      uVar2 = argptr->fp_offset;
      if ((ulong)uVar2 < 0xa1) {
        puVar5 = (undefined8 *)((ulong)uVar2 + (long)argptr->reg_save_area);
        argptr->fp_offset = uVar2 + 0x10;
      }
      else {
        puVar5 = (undefined8 *)argptr->overflow_arg_area;
        argptr->overflow_arg_area = puVar5 + 1;
      }
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                 vsnprintf,0x148,"%f",*puVar5);
      zmsg_addstr(self_02,(char *)local_50._0_8_);
      goto LAB_0020fe4d;
    default:
      goto switchD_0020fa04_caseD_65;
    case 0x66:
      uVar2 = argptr->gp_offset;
      if ((ulong)uVar2 < 0x29) {
        puVar5 = (undefined8 *)((ulong)uVar2 + (long)argptr->reg_save_area);
        argptr->gp_offset = uVar2 + 8;
      }
      else {
        puVar5 = (undefined8 *)argptr->overflow_arg_area;
        argptr->overflow_arg_area = puVar5 + 1;
      }
      pzVar8 = (zframe_t *)*puVar5;
      data = zframe_data(pzVar8);
      sVar9 = zframe_size(pzVar8);
LAB_0020feaa:
      zmsg_addmem(self_02,data,sVar9);
      break;
    case 0x68:
      uVar2 = argptr->gp_offset;
      if ((ulong)uVar2 < 0x29) {
        puVar5 = (undefined8 *)((ulong)uVar2 + (long)argptr->reg_save_area);
        argptr->gp_offset = uVar2 + 8;
      }
      else {
        puVar5 = (undefined8 *)argptr->overflow_arg_area;
        argptr->overflow_arg_area = puVar5 + 1;
      }
      local_50._0_8_ = zhashx_pack((zhashx_t *)*puVar5);
      zmsg_append(self_02,(zframe_t **)local_50);
      break;
    case 0x69:
      uVar2 = argptr->gp_offset;
      if ((ulong)uVar2 < 0x29) {
        puVar7 = (uint *)((ulong)uVar2 + (long)argptr->reg_save_area);
        argptr->gp_offset = uVar2 + 8;
      }
      else {
        puVar7 = (uint *)argptr->overflow_arg_area;
        argptr->overflow_arg_area = puVar7 + 2;
      }
      uVar10 = (ulong)*puVar7;
      format = "%d";
      goto LAB_0020fd1e;
    case 0x6d:
      uVar2 = argptr->gp_offset;
      if ((ulong)uVar2 < 0x29) {
        puVar5 = (undefined8 *)((ulong)uVar2 + (long)argptr->reg_save_area);
        argptr->gp_offset = uVar2 + 8;
      }
      else {
        puVar5 = (undefined8 *)argptr->overflow_arg_area;
        argptr->overflow_arg_area = puVar5 + 1;
      }
      self = (zmsg_t *)*puVar5;
      pzVar8 = zmsg_first(self);
      while (pzVar8 != (zframe_t *)0x0) {
        local_50._0_8_ = zframe_dup(pzVar8);
        zmsg_append(self_02,(zframe_t **)local_50);
        pzVar8 = zmsg_next(self);
      }
      break;
    case 0x6e:
      uVar2 = argptr->gp_offset;
      if ((ulong)uVar2 < 0x29) {
        puVar5 = (undefined8 *)((ulong)uVar2 + (long)argptr->reg_save_area);
        argptr->gp_offset = uVar2 + 8;
      }
      else {
        puVar5 = (undefined8 *)argptr->overflow_arg_area;
        argptr->overflow_arg_area = puVar5 + 1;
      }
      (**(code **)(*(long *)*puVar5 + 0x10))
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
      CZHelp::zmsg_addNDT(self_02,(binarydata *)local_50);
LAB_0020fe4d:
      if ((zframe_t *)local_50._0_8_ != (zframe_t *)(local_50 + 0x10)) {
        operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
      }
      break;
    case 0x70:
      uVar2 = argptr->gp_offset;
      if ((ulong)uVar2 < 0x29) {
        puVar5 = (undefined8 *)((ulong)uVar2 + (long)argptr->reg_save_area);
        argptr->gp_offset = uVar2 + 8;
      }
      else {
        puVar5 = (undefined8 *)argptr->overflow_arg_area;
        argptr->overflow_arg_area = puVar5 + 1;
      }
      local_50._0_8_ = *puVar5;
      sVar9 = 8;
      data_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50;
      goto LAB_0020fd73;
    case 0x73:
      uVar2 = argptr->gp_offset;
      if ((ulong)uVar2 < 0x29) {
        puVar5 = (undefined8 *)((ulong)uVar2 + (long)argptr->reg_save_area);
        argptr->gp_offset = uVar2 + 8;
      }
      else {
        puVar5 = (undefined8 *)argptr->overflow_arg_area;
        argptr->overflow_arg_area = puVar5 + 1;
      }
      zmsg_addstr(self_02,(char *)*puVar5);
      break;
    case 0x75:
      uVar2 = argptr->gp_offset;
      if ((ulong)uVar2 < 0x29) {
        puVar7 = (uint *)((ulong)uVar2 + (long)argptr->reg_save_area);
        argptr->gp_offset = uVar2 + 8;
      }
      else {
        puVar7 = (uint *)argptr->overflow_arg_area;
        argptr->overflow_arg_area = puVar7 + 2;
      }
      uVar10 = (ulong)*puVar7;
      format = "%ud";
      goto LAB_0020fd1e;
    case 0x7a:
      sVar9 = 0;
      data_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
LAB_0020fd73:
      zmsg_addmem(self_02,data_00,sVar9);
    }
LAB_0020feb9:
    picture = (char *)((byte *)picture + 1);
  } while( true );
switchD_0020fa04_caseD_65:
  zsys_error("zsock: invalid picture element \'%c\'");
  goto LAB_0020feb9;
}

Assistant:

zmsg_t* czhelp_zmsg_createv(const char *picture, va_list argptr){
    zmsg_t *msg = zmsg_new ();
    while (*picture) {
//        std::cerr << picture << "\n";
        if (*picture == 'i')
            zmsg_addstrf (msg, "%d", va_arg (argptr, int));
        else if (*picture == '1')
            zmsg_addstrf (msg, "%" PRIu8, (uint8_t) va_arg (argptr, int));
        else if (*picture == '2')
            zmsg_addstrf (msg, "%" PRIu16, (uint16_t) va_arg (argptr, int));
        else if (*picture == '4')
            zmsg_addstrf (msg, "%" PRIu32, va_arg (argptr, uint32_t));
        else if (*picture == '8')
            zmsg_addstrf (msg, "%" PRIu64, va_arg (argptr, uint64_t));
        else if (*picture == 'u')    //  Deprecated, use 4 or 8 instead
            zmsg_addstrf (msg, "%ud", va_arg (argptr, uint));
        else if (*picture == 'd')
            zmsg_addstr (msg, std::to_string(va_arg (argptr, double)).c_str());
        else if (*picture == 's') {
            char *str = va_arg(argptr, char *);
            zmsg_addstr (msg, str);
        }
        else if (*picture == 'b') {
            //  Note function arguments may be expanded in reverse order,
            //  so we cannot use va_arg macro twice in a single call
            byte *data = va_arg (argptr, byte *);
            zmsg_addmem (msg, data, va_arg (argptr, int));
        }
        else if (*picture == 'c') {
            zchunk_t *chunk = va_arg (argptr, zchunk_t *);
            assert (zchunk_is (chunk));
            zmsg_addmem (msg, zchunk_data (chunk), zchunk_size (chunk));
        }
        else if (*picture == 'f') {
            zframe_t *frame = va_arg (argptr, zframe_t *);
            assert (zframe_is (frame));
            zmsg_addmem (msg, zframe_data (frame), zframe_size (frame));
        }
        else if (*picture == 'U') {
            zuuid_t *uuid = va_arg (argptr, zuuid_t *);
            zmsg_addmem (msg, zuuid_data (uuid), zuuid_size (uuid));
        }
        else if (*picture == 'p') {
            void *pointer = va_arg (argptr, void *);
            zmsg_addmem (msg, &pointer, sizeof (void *));
        }
        else if (*picture == 'h') {
            zhashx_t *hash = va_arg (argptr, zhashx_t *);
            zframe_t *frame = zhashx_pack (hash);
            zmsg_append (msg, &frame);
        }
        else if (*picture == 'm') {
            zframe_t *frame;
            zmsg_t *zmsg = va_arg (argptr, zmsg_t *);
            for (frame = zmsg_first (zmsg); frame;
                    frame = zmsg_next (zmsg) ) {
                zframe_t *frame_dup = zframe_dup (frame);
                zmsg_append (msg, &frame_dup);
            }
        }
        else if (*picture == 'n') {
            NetworkDataType *val = va_arg(argptr, NetworkDataType *);
            binarydata dat = val->encode();
            CZHelp::zmsg_addNDT(msg, dat);
        }
        else if (*picture == 'z')
            zmsg_addmem (msg, NULL, 0);
        else {
            zsys_error ("zsock: invalid picture element '%c'", *picture);
            assert (false);
        }
        picture++;
    }
    return msg;
}